

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirWatcherGeneric.cpp
# Opt level: O0

void __thiscall efsw::DirWatcherGeneric::resetDirectory(DirWatcherGeneric *this,string *directory)

{
  char cVar1;
  bool bVar2;
  char cVar3;
  long lVar4;
  char *pcVar5;
  string local_a8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88 [32];
  string local_68 [8];
  string parentPath;
  string local_38 [8];
  string dir;
  string *directory_local;
  DirWatcherGeneric *this_local;
  
  std::__cxx11::string::string(local_38,(string *)directory);
  bVar2 = std::operator!=(&(this->Watch->super_Watcher).Directory,directory);
  if (!bVar2) goto LAB_00122ca9;
  lVar4 = std::__cxx11::string::size();
  if (lVar4 != 0) {
    pcVar5 = (char *)std::__cxx11::string::at((ulong)directory);
    cVar1 = *pcVar5;
    cVar3 = FileSystem::getOSSlash();
    if (cVar1 == cVar3) goto LAB_00122ca9;
    std::__cxx11::string::size();
    pcVar5 = (char *)std::__cxx11::string::at((ulong)directory);
    cVar1 = *pcVar5;
    cVar3 = FileSystem::getOSSlash();
    if (cVar1 == cVar3) goto LAB_00122ca9;
  }
  if (this->Parent != (DirWatcherGeneric *)0x0) {
    std::__cxx11::string::string(local_68,(string *)&this->Parent->DirSnap);
    FileSystem::dirAddSlashAtEnd((string *)local_68);
    FileSystem::dirAddSlashAtEnd(directory);
    std::operator+(local_88,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_68);
    std::__cxx11::string::operator=(local_38,(string *)local_88);
    std::__cxx11::string::~string((string *)local_88);
    std::__cxx11::string::~string(local_68);
  }
LAB_00122ca9:
  std::__cxx11::string::string(local_a8,local_38);
  DirectorySnapshot::setDirectoryInfo(&this->DirSnap,(string *)local_a8);
  std::__cxx11::string::~string(local_a8);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void DirWatcherGeneric::resetDirectory( std::string directory ) {
	std::string dir( directory );

	/// Is this a recursive watch?
	if ( Watch->Directory != directory ) {
		if ( !( directory.size() &&
				( directory.at( 0 ) == FileSystem::getOSSlash() ||
				  directory.at( directory.size() - 1 ) == FileSystem::getOSSlash() ) ) ) {
			/// Get the real directory
			if ( NULL != Parent ) {
				std::string parentPath( Parent->DirSnap.DirectoryInfo.Filepath );
				FileSystem::dirAddSlashAtEnd( parentPath );
				FileSystem::dirAddSlashAtEnd( directory );

				dir = parentPath + directory;
			} else {
				efDEBUG( "resetDirectory(): Parent is NULL. Fatal error." );
			}
		}
	}

	DirSnap.setDirectoryInfo( dir );
}